

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_strtoi(char *str,char **endptr)

{
  int iVar1;
  int iVar2;
  
  if (str != (char *)0x0) {
    for (; *str == ' '; str = str + 1) {
    }
    if (*str == '-') {
      str = str + 1;
      iVar1 = -1;
    }
    else {
      iVar1 = 1;
    }
    iVar2 = 0;
    for (; (byte)(*str - 0x30U) < 10; str = str + 1) {
      iVar2 = (uint)(byte)(*str - 0x30U) + iVar2 * 10;
    }
    if (endptr != (char **)0x0) {
      *endptr = str;
    }
    return iVar2 * iVar1;
  }
  __assert_fail("str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0xda8,"int nk_strtoi(const char *, char **)");
}

Assistant:

NK_API int
nk_strtoi(const char *str, char **endptr)
{
    int neg = 1;
    const char *p = str;
    int value = 0;

    NK_ASSERT(str);
    if (!str) return 0;

    /* skip whitespace */
    while (*p == ' ') p++;
    if (*p == '-') {
        neg = -1;
        p++;
    }
    while (*p && *p >= '0' && *p <= '9') {
        value = value * 10 + (int) (*p - '0');
        p++;
    }
    if (endptr)
        *endptr = (char*)p;
    return neg*value;
}